

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::visitChar(TestSpecParser *this,char c)

{
  bool bVar1;
  size_t sVar2;
  undefined1 local_38 [47];
  char c_local;
  TestSpecParser *this_local;
  
  local_38[0x27] = c;
  unique0x100001b6 = this;
  if (this->m_mode == None) {
    if (c == ' ') {
      return;
    }
    if (c == '\"') {
      sVar2 = this->m_pos + 1;
      this->m_pos = sVar2;
      startNewMode(this,QuotedName,sVar2);
      return;
    }
    if (c == '[') {
      sVar2 = this->m_pos + 1;
      this->m_pos = sVar2;
      startNewMode(this,Tag,sVar2);
      return;
    }
    if (c == '~') {
      this->m_exclusion = true;
      return;
    }
    startNewMode(this,Name,this->m_pos);
  }
  if (this->m_mode == Name) {
    if (local_38[0x27] == ',') {
      addPattern<Catch::TestSpec::NamePattern>(this);
      addFilter(this);
    }
    else if (local_38[0x27] == '[') {
      subString_abi_cxx11_((TestSpecParser *)local_38);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"exclude:");
      std::__cxx11::string::~string((string *)local_38);
      if (bVar1) {
        this->m_exclusion = true;
      }
      else {
        addPattern<Catch::TestSpec::NamePattern>(this);
      }
      sVar2 = this->m_pos + 1;
      this->m_pos = sVar2;
      startNewMode(this,Tag,sVar2);
    }
  }
  else if ((this->m_mode == QuotedName) && (local_38[0x27] == '\"')) {
    addPattern<Catch::TestSpec::NamePattern>(this);
  }
  else if ((this->m_mode == Tag) && (local_38[0x27] == ']')) {
    addPattern<Catch::TestSpec::TagPattern>(this);
  }
  return;
}

Assistant:

void visitChar( char c ) {
            if( m_mode == None ) {
                switch( c ) {
                case ' ': return;
                case '~': m_exclusion = true; return;
                case '[': return startNewMode( Tag, ++m_pos );
                case '"': return startNewMode( QuotedName, ++m_pos );
                default: startNewMode( Name, m_pos ); break;
                }
            }
            if( m_mode == Name ) {
                if( c == ',' ) {
                    addPattern<TestSpec::NamePattern>();
                    addFilter();
                }
                else if( c == '[' ) {
                    if( subString() == "exclude:" )
                        m_exclusion = true;
                    else
                        addPattern<TestSpec::NamePattern>();
                    startNewMode( Tag, ++m_pos );
                }
            }
            else if( m_mode == QuotedName && c == '"' )
                addPattern<TestSpec::NamePattern>();
            else if( m_mode == Tag && c == ']' )
                addPattern<TestSpec::TagPattern>();
        }